

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyNP.hpp
# Opt level: O3

void njoy::ENDFtk::TabulationRecord::verifyNP(uint index,uint NP)

{
  undefined8 *puVar1;
  
  if (index == NP) {
    return;
  }
  tools::Log::error<char_const*>("Inconsistent NP value between interpolation table and data table")
  ;
  tools::Log::info<char_const*,unsigned_int>("Last index interpolation table: {}",index);
  tools::Log::info<char_const*,unsigned_int>("Number of points in data table: {}",NP);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyNP( unsigned int index, unsigned int NP ) {
  const bool inconsistentNP =
    ( index != NP );

  if ( inconsistentNP ) {
    Log::error( "Inconsistent NP value between interpolation table and "
                "data table" );
    Log::info( "Last index interpolation table: {}", index );
    Log::info( "Number of points in data table: {}", NP );
    throw std::exception();
  }
}